

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O1

void pzshape::TPZShapeQuad::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int j;
  ulong uVar8;
  TPZFNMatrix<20,_double> phi1;
  TPZFNMatrix<20,_double> phi0;
  TPZFNMatrix<20,_double> dphi1;
  TPZFNMatrix<20,_double> dphi0;
  TPZFMatrix<double> local_510;
  double local_480 [21];
  TPZFMatrix<double> local_3d8;
  double local_348 [21];
  TPZFMatrix<double> local_2a0;
  double local_210 [21];
  TPZFMatrix<double> local_168;
  double local_d8 [21];
  
  if (1 < order) {
    uVar5 = order - 1;
    uVar2 = (ulong)(uVar5 * uVar5);
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar2) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                (phi,uVar2,1);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < (long)uVar2)) {
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                (dphi,2,uVar2);
    }
    lVar3 = (long)(int)uVar5;
    local_3d8.fElem = local_348;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_3d8.fSize = 0x14;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar3;
    local_3d8.fGiven = local_3d8.fElem;
    TPZVec<int>::TPZVec(&local_3d8.fPivot.super_TPZVec<int>,0);
    local_3d8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_3d8.fPivot.super_TPZVec<int>.fStore = local_3d8.fPivot.fExtAlloc;
    local_3d8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_3d8.fWork.fStore = (double *)0x0;
    local_3d8.fWork.fNElements = 0;
    local_3d8.fWork.fNAlloc = 0;
    pdVar1 = (double *)0x0;
    if ((uVar5 != 0) && (pdVar1 = local_3d8.fElem, 0x15 < order)) {
      pdVar1 = (double *)operator_new__(lVar3 * 8);
    }
    local_3d8.fElem = pdVar1;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_510.fElem = local_480;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_510.fSize = 0x14;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar3;
    local_510.fGiven = local_510.fElem;
    TPZVec<int>::TPZVec(&local_510.fPivot.super_TPZVec<int>,0);
    local_510.fPivot.super_TPZVec<int>.fStore = local_510.fPivot.fExtAlloc;
    local_510.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_510.fPivot.super_TPZVec<int>.fNElements = 0;
    local_510.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_510.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_510.fWork.fStore = (double *)0x0;
    local_510.fWork.fNElements = 0;
    local_510.fWork.fNAlloc = 0;
    if (uVar5 == 0) {
      local_510.fElem = (double *)0x0;
    }
    else if (0x15 < order) {
      local_510.fElem = (double *)operator_new__(lVar3 * 8);
    }
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_168.fElem = local_d8;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_168.fSize = 0x14;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar3;
    local_168.fGiven = local_168.fElem;
    TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
    local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
    local_168.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_168.fPivot.super_TPZVec<int>.fNElements = 0;
    local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_168.fWork.fStore = (double *)0x0;
    local_168.fWork.fNElements = 0;
    local_168.fWork.fNAlloc = 0;
    if (uVar5 == 0) {
      local_168.fElem = (double *)0x0;
    }
    else if (0x15 < order) {
      local_168.fElem = (double *)operator_new__(lVar3 * 8);
    }
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_2a0.fElem = local_210;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_2a0.fSize = 0x14;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar3;
    local_2a0.fGiven = local_2a0.fElem;
    TPZVec<int>::TPZVec(&local_2a0.fPivot.super_TPZVec<int>,0);
    local_2a0.fPivot.super_TPZVec<int>.fStore = local_2a0.fPivot.fExtAlloc;
    local_2a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_2a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_2a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_2a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_2a0.fWork.fStore = (double *)0x0;
    local_2a0.fWork.fNElements = 0;
    local_2a0.fWork.fNAlloc = 0;
    if (uVar5 == 0) {
      local_2a0.fElem = (double *)0x0;
    }
    else if (0x15 < order) {
      local_2a0.fElem = (double *)operator_new__(lVar3 * 8);
    }
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    (*(code *)TPZShapeLinear::fOrthogonal)(*x->fStore,uVar5,&local_3d8,&local_168);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[1],uVar5,&local_510,&local_2a0);
    uVar2 = 1;
    if (1 < (int)uVar5) {
      uVar2 = (ulong)uVar5;
    }
    lVar7 = 0;
    uVar4 = 0;
    do {
      uVar8 = 0;
      lVar6 = lVar7;
      do {
        if ((local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
           (local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
           (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((lVar6 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[lVar6] = local_3d8.fElem[uVar4] * local_510.fElem[uVar8];
        if ((local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
           (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (lVar6 < 0)) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6] =
             local_168.fElem[local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar4] *
             local_510.fElem[uVar8];
        if ((local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
           (local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (lVar6 < 0)) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6 + 1] =
             local_3d8.fElem[uVar4] *
             local_2a0.fElem[local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar8];
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 1;
      } while (uVar2 != uVar8);
      uVar4 = uVar4 + 1;
      lVar7 = lVar7 + lVar3;
    } while (uVar4 != uVar2);
    TPZFMatrix<double>::~TPZFMatrix(&local_2a0,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_168,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_510,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_3d8,&PTR_PTR_0183e568);
  }
  return;
}

Assistant:

void TPZShapeQuad::ShapeInternal(TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        
        if((order-2) < 0) return;
        int ord1 = order - 1;
        int numshape = (order-1)*(order-1);
        if(numshape > phi.Rows() || phi.Cols() < 1) phi.Resize(numshape,1);
        if(dphi.Rows() < 2 || dphi.Cols() < numshape) dphi.Resize(2,numshape);
        TPZFNMatrix<20, REAL> phi0(ord1,1),phi1(ord1,1),dphi0(1,ord1),dphi1(1,ord1);
        TPZShapeLinear::fOrthogonal(x[0],ord1,phi0,dphi0);
        TPZShapeLinear::fOrthogonal(x[1],ord1,phi1,dphi1);
        for (int i=0;i<ord1;i++) {
            for (int j=0;j<ord1;j++) {
                int index = i*ord1+j;
                phi(index,0) =  phi0(i,0)* phi1(j,0);
                dphi(0,index) = dphi0(0,i)* phi1(j,0);
                dphi(1,index) =  phi0(i,0)*dphi1(0,j);
            }
        }
      
    }